

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

UBool icu_63::CollationBuilder::sameCEs
                (int64_t *ces1,int32_t ces1Length,int64_t *ces2,int32_t ces2Length)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (ces1Length == ces2Length) {
    uVar3 = (ulong)(uint)ces1Length;
    if (ces1Length < 1) {
      uVar3 = uVar2;
    }
    do {
      uVar1 = uVar2;
      if (uVar3 == uVar1) break;
      uVar2 = uVar1 + 1;
    } while (ces1[uVar1] == ces2[uVar1]);
    uVar2 = (ulong)((long)ces1Length <= (long)uVar1);
  }
  return (UBool)uVar2;
}

Assistant:

UBool
CollationBuilder::sameCEs(const int64_t ces1[], int32_t ces1Length,
                          const int64_t ces2[], int32_t ces2Length) {
    if(ces1Length != ces2Length) {
        return FALSE;
    }
    U_ASSERT(ces1Length <= Collation::MAX_EXPANSION_LENGTH);
    for(int32_t i = 0; i < ces1Length; ++i) {
        if(ces1[i] != ces2[i]) { return FALSE; }
    }
    return TRUE;
}